

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_union_constructor(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  t_type *type;
  t_const_value *ptVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  t_struct *ttype;
  t_java_generator *this_00;
  char *pcVar7;
  bool bVar8;
  pointer pptVar9;
  string local_e0;
  string local_c0;
  t_struct *local_a0;
  t_const_value *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"public ",7);
  type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() {",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar9 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_a0 = tstruct;
  if (pptVar9 ==
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar8 = true;
  }
  else {
    bVar8 = false;
    do {
      type = t_type::get_true_type((*pptVar9)->type_);
      ptVar5 = (*pptVar9)->value_;
      if (ptVar5 != (t_const_value *)0x0) {
        local_98 = ptVar5;
        poVar4 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"super(_Fields.",0xe);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        this_00 = (t_java_generator *)((*pptVar9)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,this_00,
                   (pointer)((long)&(this_00->super_t_oop_generator).super_t_generator.
                                    _vptr_t_generator + ((*pptVar9)->name_)._M_string_length));
        constant_name(&local_e0,this_00,&local_50);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
        render_const_value_abi_cxx11_(&local_c0,this,out,type,(*pptVar9)->value_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        bVar8 = true;
        ptVar5 = local_98;
      }
    } while ((ptVar5 == (t_const_value *)0x0) &&
            (pptVar9 = pptVar9 + 1,
            pptVar9 !=
            (local_a0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish));
    bVar8 = !bVar8;
  }
  ttype = local_a0;
  if (bVar8) {
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"super();",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"public ",7);
  type_name_abi_cxx11_(&local_e0,this,&ttype->super_t_type,false,false,false,false);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"(_Fields setField, java.lang.Object value) {",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  super(setField, value);",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"public ",7);
  type_name_abi_cxx11_(&local_e0,this,&ttype->super_t_type,false,false,false,false);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
  type_name_abi_cxx11_(&local_c0,this,&ttype->super_t_type,false,false,false,false);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," other) {",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  super(other);",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"public ",7);
  iVar3 = (*(ttype->super_t_type).super_t_doc._vptr_t_doc[3])(ttype);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," deepCopy() {",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  return new ",0xd);
  iVar3 = (*(ttype->super_t_type).super_t_doc._vptr_t_doc[3])(ttype);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var_00,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(this);",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  for (pptVar9 = (ttype->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      pptVar9 !=
      (ttype->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
    ptVar5 = (t_const_value *)(*pptVar9)->type_;
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"public static ",0xe);
    type_name_abi_cxx11_(&local_e0,this,&ttype->super_t_type,false,false,false,false);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                        ((*pptVar9)->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
    type_name_abi_cxx11_(&local_c0,this,(t_type *)ptVar5,false,false,false,false);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," value) {",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    type_name_abi_cxx11_(&local_e0,this,&ttype->super_t_type,false,false,false,false);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," x = new ",9);
    type_name_abi_cxx11_(&local_c0,this,&ttype->super_t_type,false,false,false,false);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"();",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    local_98 = ptVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  x.set",7);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar2 = ((*pptVar9)->name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + ((*pptVar9)->name_)._M_string_length);
    get_cap_name(&local_e0,this,&local_70);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(value);",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    ptVar5 = local_98;
    ttype = local_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  return x;",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    iVar3 = (*((t_doc *)&ptVar5->mapVal_)->_vptr_t_doc[7])(ptVar5);
    if ((char)iVar3 != '\0') {
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"public static ",0xe);
      type_name_abi_cxx11_(&local_e0,this,&ttype->super_t_type,false,false,false,false);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                          ((*pptVar9)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(byte[] value) {",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      type_name_abi_cxx11_(&local_e0,this,&ttype->super_t_type,false,false,false,false);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," x = new ",9);
      type_name_abi_cxx11_(&local_c0,this,&ttype->super_t_type,false,false,false,false);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"();",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  x.set",7);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar2 = ((*pptVar9)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + ((*pptVar9)->name_)._M_string_length);
      get_cap_name(&local_e0,this,&local_90);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      bVar8 = this->unsafe_binaries_;
      poVar4 = t_generator::indent((t_generator *)this,out);
      if (bVar8 == true) {
        lVar6 = 0x22;
        pcVar7 = "(java.nio.ByteBuffer.wrap(value));";
      }
      else {
        lVar6 = 0x2a;
        pcVar7 = "(java.nio.ByteBuffer.wrap(value.clone()));";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar6);
      ttype = local_a0;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  return x;",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  return;
}

Assistant:

void t_java_generator::generate_union_constructor(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  indent(out) << "public " << type_name(tstruct) << "() {" << endl;
  indent_up();
  bool default_value = false;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* type = get_true_type((*m_iter)->get_type());
    if ((*m_iter)->get_value() != nullptr) {
      indent(out) << "super(_Fields." << constant_name((*m_iter)->get_name()) << ", "
                  << render_const_value(out, type, (*m_iter)->get_value()) << ");" << endl;
      default_value = true;
      break;
    }
  }
  if (default_value == false) {
    indent(out) << "super();" << endl;
  }
  indent_down();
  indent(out) << "}" << endl << endl;

  indent(out) << "public " << type_name(tstruct) << "(_Fields setField, java.lang.Object value) {" << endl;
  indent(out) << "  super(setField, value);" << endl;
  indent(out) << "}" << endl << endl;

  indent(out) << "public " << type_name(tstruct) << "(" << type_name(tstruct) << " other) {"
              << endl;
  indent(out) << "  super(other);" << endl;
  indent(out) << "}" << endl;

  indent(out) << "public " << tstruct->get_name() << " deepCopy() {" << endl;
  indent(out) << "  return new " << tstruct->get_name() << "(this);" << endl;
  indent(out) << "}" << endl << endl;

  // generate "constructors" for each field
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* type = (*m_iter)->get_type();
    indent(out) << "public static " << type_name(tstruct) << " " << (*m_iter)->get_name() << "("
                << type_name(type) << " value) {" << endl;
    indent(out) << "  " << type_name(tstruct) << " x = new " << type_name(tstruct) << "();" << endl;
    indent(out) << "  x.set" << get_cap_name((*m_iter)->get_name()) << "(value);" << endl;
    indent(out) << "  return x;" << endl;
    indent(out) << "}" << endl << endl;

    if (type->is_binary()) {
      indent(out) << "public static " << type_name(tstruct) << " " << (*m_iter)->get_name()
                  << "(byte[] value) {" << endl;
      indent(out) << "  " << type_name(tstruct) << " x = new " << type_name(tstruct) << "();"
                  << endl;
      indent(out) << "  x.set" << get_cap_name((*m_iter)->get_name());
      if(unsafe_binaries_) {
        indent(out) << "(java.nio.ByteBuffer.wrap(value));" << endl;
      }else{
        indent(out) << "(java.nio.ByteBuffer.wrap(value.clone()));" << endl;
      }
      indent(out) << "  return x;" << endl;
      indent(out) << "}" << endl << endl;
    }
  }
}